

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_meta(ly_ctx *ctx,lyd_node *parent,lys_module *module,char *name,char *val_str,
                   uint32_t options,lyd_meta **meta)

{
  long lVar1;
  long lVar2;
  char *value;
  char *mod;
  lys_module *parent_00;
  LY_ERR LVar3;
  char *pcVar4;
  size_t value_len;
  lysc_node *local_138;
  char *local_f0;
  lyd_node *local_d8;
  lyd_node *local_d0;
  lyd_node *local_c8;
  ly_ctx *local_b8;
  ly_ctx *local_b0;
  long local_a8;
  long local_98;
  long local_90;
  lyd_node *local_88;
  lyd_node *local_80;
  ly_bool store_only;
  size_t sStack_68;
  ly_bool clear_dflt;
  size_t name_len;
  size_t pref_len;
  char *tmp;
  char *prefix;
  char *pcStack_40;
  uint32_t options_local;
  char *val_str_local;
  char *name_local;
  lys_module *module_local;
  lyd_node *parent_local;
  ly_ctx *ctx_local;
  
  prefix._4_4_ = options;
  pcStack_40 = val_str;
  val_str_local = name;
  name_local = (char *)module;
  module_local = (lys_module *)parent;
  parent_local = (lyd_node *)ctx;
  if ((ctx == (ly_ctx *)0x0) && (parent == (lyd_node *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx || parent",
           "lyd_new_meta");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if (name == (char *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_meta");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if ((module == (lys_module *)0x0) && (pcVar4 = strchr(name,0x3a), pcVar4 == (char *)0x0)) {
    ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",
           "module || strchr(name, \':\')","lyd_new_meta");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if ((module_local == (lys_module *)0x0) && (meta == (lyd_meta **)0x0)) {
    ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","parent || meta",
           "lyd_new_meta");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else {
    if ((parent_local != (lyd_node *)0x0) && (module_local != (lys_module *)0x0)) {
      if (module_local->name == (char *)0x0) {
        lVar1._0_1_ = module_local->implemented;
        lVar1._1_1_ = module_local->to_compile;
        lVar1._2_1_ = module_local->latest_revision;
        lVar1._3_5_ = *(undefined5 *)&module_local->field_0x7b;
      }
      else {
        lVar1 = **(long **)(module_local->name + 8);
      }
      if (lVar1 != 0) {
        if (module_local == (lys_module *)0x0) {
          local_88 = (lyd_node *)0x0;
        }
        else {
          if (module_local->name == (char *)0x0) {
            local_80 = *(lyd_node **)&module_local->implemented;
          }
          else {
            local_80 = (lyd_node *)**(long **)(module_local->name + 8);
          }
          local_88 = local_80;
        }
        if (parent_local != local_88) {
          ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINVAL,
                 "Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    if (module_local != (lys_module *)0x0) {
      if (module_local->name == (char *)0x0) {
        lVar2._0_1_ = module_local->implemented;
        lVar2._1_1_ = module_local->to_compile;
        lVar2._2_1_ = module_local->latest_revision;
        lVar2._3_5_ = *(undefined5 *)&module_local->field_0x7b;
      }
      else {
        lVar2 = **(long **)(module_local->name + 8);
      }
      if (((lVar2 != 0) && (name_local != (char *)0x0)) && (*(long *)name_local != 0)) {
        if (module_local == (lys_module *)0x0) {
          local_98 = 0;
        }
        else {
          if (module_local->name == (char *)0x0) {
            local_90._0_1_ = module_local->implemented;
            local_90._1_1_ = module_local->to_compile;
            local_90._2_1_ = module_local->latest_revision;
            local_90._3_5_ = *(undefined5 *)&module_local->field_0x7b;
          }
          else {
            local_90 = **(long **)(module_local->name + 8);
          }
          local_98 = local_90;
        }
        if (name_local == (char *)0x0) {
          local_a8 = 0;
        }
        else {
          local_a8 = *(long *)name_local;
        }
        if (local_98 != local_a8) {
          if (module_local == (lys_module *)0x0) {
            local_b8 = (ly_ctx *)0x0;
          }
          else {
            if (module_local->name == (char *)0x0) {
              local_b0 = *(ly_ctx **)&module_local->implemented;
            }
            else {
              local_b0 = (ly_ctx *)**(undefined8 **)(module_local->name + 8);
            }
            local_b8 = local_b0;
          }
          ly_log(local_b8,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    if (((parent_local != (lyd_node *)0x0) && (name_local != (char *)0x0)) &&
       (*(long *)name_local != 0)) {
      if (name_local == (char *)0x0) {
        local_c8 = (lyd_node *)0x0;
      }
      else {
        local_c8 = *(lyd_node **)name_local;
      }
      if (parent_local != local_c8) {
        ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINVAL,
               "Different contexts mixed in a single function call.");
        return LY_EINVAL;
      }
    }
    if (parent_local == (lyd_node *)0x0) {
      if (name_local == (char *)0x0) {
        if (module_local->name == (char *)0x0) {
          local_d8 = *(lyd_node **)&module_local->implemented;
        }
        else {
          local_d8 = (lyd_node *)**(undefined8 **)(module_local->name + 8);
        }
        local_d0 = local_d8;
      }
      else {
        local_d0 = *(lyd_node **)name_local;
      }
      parent_local = local_d0;
    }
    if ((module_local == (lys_module *)0x0) || (module_local->name != (char *)0x0)) {
      if (meta != (lyd_meta **)0x0) {
        *meta = (lyd_meta *)0x0;
      }
      pref_len = (size_t)val_str_local;
      LVar3 = ly_parse_nodeid((char **)&pref_len,&tmp,&name_len,&val_str_local,
                              &stack0xffffffffffffff98);
      if ((LVar3 == LY_SUCCESS) && (*(char *)pref_len == '\0')) {
        if ((tmp == (char *)0x0) ||
           (name_local = (char *)ly_ctx_get_module_implemented2((ly_ctx *)parent_local,tmp,name_len)
           , (lys_module *)name_local != (lys_module *)0x0)) {
          parent_00 = module_local;
          mod = name_local;
          pcVar4 = val_str_local;
          if (pcStack_40 == (char *)0x0) {
            pcStack_40 = "";
          }
          value = pcStack_40;
          value_len = strlen(pcStack_40);
          if (module_local == (lys_module *)0x0) {
            local_138 = (lysc_node *)0x0;
          }
          else {
            local_138 = (lysc_node *)module_local->name;
          }
          ctx_local._4_4_ =
               lyd_create_meta((lyd_node *)parent_00,meta,(lys_module *)mod,pcVar4,sStack_68,value,
                               value_len,'\0',(byte)options & 2,(ly_bool *)0x0,LY_VALUE_JSON,
                               (void *)0x0,0x3f3,local_138,(byte)options & 0x10,(ly_bool *)0x0);
        }
        else {
          ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINVAL,"Module \"%.*s\" not found.",
                 name_len & 0xffffffff,tmp);
          ctx_local._4_4_ = LY_ENOTFOUND;
        }
      }
      else {
        ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINVAL,"Metadata name \"%s\" is not valid.",
               val_str_local);
        ctx_local._4_4_ = LY_EINVAL;
      }
    }
    else {
      if (module_local->name == (char *)0x0) {
        local_f0 = module_local->dsc;
      }
      else {
        local_f0 = *(char **)(module_local->name + 0x28);
      }
      ly_log((ly_ctx *)parent_local,LY_LLERR,LY_EINVAL,
             "Cannot add metadata \"%s\" to an opaque node \"%s\".",val_str_local,local_f0);
      ctx_local._4_4_ = LY_EINVAL;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_meta(const struct ly_ctx *ctx, struct lyd_node *parent, const struct lys_module *module, const char *name,
        const char *val_str, uint32_t options, struct lyd_meta **meta)
{
    const char *prefix, *tmp;
    size_t pref_len, name_len;
    ly_bool clear_dflt = options & LYD_NEW_META_CLEAR_DFLT;
    ly_bool store_only = options & LYD_NEW_VAL_STORE_ONLY;

    LY_CHECK_ARG_RET(ctx, ctx || parent, name, module || strchr(name, ':'), parent || meta, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);
    if (!ctx) {
        ctx = module ? module->ctx : LYD_CTX(parent);
    }

    if (parent && !parent->schema) {
        LOGERR(ctx, LY_EINVAL, "Cannot add metadata \"%s\" to an opaque node \"%s\".", name, LYD_NAME(parent));
        return LY_EINVAL;
    }
    if (meta) {
        *meta = NULL;
    }

    /* parse the name */
    tmp = name;
    if (ly_parse_nodeid(&tmp, &prefix, &pref_len, &name, &name_len) || tmp[0]) {
        LOGERR(ctx, LY_EINVAL, "Metadata name \"%s\" is not valid.", name);
        return LY_EINVAL;
    }

    /* find the module */
    if (prefix) {
        module = ly_ctx_get_module_implemented2(ctx, prefix, pref_len);
        LY_CHECK_ERR_RET(!module, LOGERR(ctx, LY_EINVAL, "Module \"%.*s\" not found.", (int)pref_len, prefix), LY_ENOTFOUND);
    }

    /* set value if none */
    if (!val_str) {
        val_str = "";
    }

    return lyd_create_meta(parent, meta, module, name, name_len, val_str, strlen(val_str), 0, store_only, NULL, LY_VALUE_JSON,
            NULL, LYD_HINT_DATA, parent ? parent->schema : NULL, clear_dflt, NULL);
}